

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O1

RK_S32 mpp_av1_loop_filter_params(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  bool bVar1;
  RK_S32 RVar2;
  RK_S32 RVar3;
  long lVar4;
  RK_U32 value;
  RK_S8 *local_40;
  RK_S8 *local_38;
  
  if ((ctx->coded_lossless == 0) && (current->allow_intrabc == '\0')) {
    RVar2 = mpp_av1_read_unsigned(gb,6,"loop_filter_level[0]",&value,0,0x3f);
    if (-1 < RVar2) {
      current->loop_filter_level[0] = (RK_U8)value;
      RVar3 = mpp_av1_read_unsigned(gb,6,"loop_filter_level[1]",&value,0,0x3f);
      if (RVar3 < 0) {
        RVar2 = -1;
      }
      else {
        current->loop_filter_level[1] = (RK_U8)value;
        if ((1 < ctx->num_planes) &&
           ((current->loop_filter_level[0] != '\0' || (current->loop_filter_level[1] != '\0')))) {
          RVar3 = mpp_av1_read_unsigned(gb,6,"loop_filter_level[2]",&value,0,0x3f);
          if (RVar3 < 0) {
            return -1;
          }
          current->loop_filter_level[2] = (RK_U8)value;
          RVar3 = mpp_av1_read_unsigned(gb,6,"loop_filter_level[3]",&value,0,0x3f);
          if (RVar3 < 0) {
            return -1;
          }
          current->loop_filter_level[3] = (RK_U8)value;
        }
        if (((byte)av1d_debug & 2) != 0) {
          _mpp_log_l(4,"av1d_cbs","orderhint %d loop_filter_level %d %d %d %d\n",
                     "mpp_av1_loop_filter_params",(ulong)current->order_hint,
                     (ulong)current->loop_filter_level[0],(ulong)current->loop_filter_level[1],
                     (ulong)current->loop_filter_level[2],(ulong)current->loop_filter_level[3]);
        }
        RVar3 = mpp_av1_read_unsigned(gb,3,"loop_filter_sharpness",&value,0,7);
        if (RVar3 < 0) {
          RVar2 = -1;
        }
        else {
          current->loop_filter_sharpness = (RK_U8)value;
          RVar3 = mpp_av1_read_unsigned(gb,1,"loop_filter_delta_enabled",&value,0,1);
          if (RVar3 < 0) {
            RVar2 = -1;
          }
          else {
            current->loop_filter_delta_enabled = (RK_U8)value;
            if (current->loop_filter_delta_enabled == '\0') {
              lVar4 = 0;
              do {
                current->loop_filter_ref_deltas[lVar4] = "\x01"[lVar4];
                lVar4 = lVar4 + 1;
              } while (lVar4 != 8);
              current->loop_filter_mode_deltas[0] = '\0';
              current->loop_filter_mode_deltas[1] = '\0';
            }
            else {
              if ((ulong)current->primary_ref_frame == 7) {
                local_38 = "\x01";
                local_40 = "";
              }
              else {
                local_38 = ctx->ref_s[current->ref_frame_idx[current->primary_ref_frame]].
                           loop_filter_ref_deltas;
                local_40 = ctx->ref_s[current->ref_frame_idx[current->primary_ref_frame]].
                           loop_filter_mode_deltas;
              }
              RVar3 = mpp_av1_read_unsigned(gb,1,"loop_filter_delta_update",&value,0,1);
              if (RVar3 < 0) {
LAB_001c6d1d:
                RVar2 = -1;
                bVar1 = false;
              }
              else {
                current->loop_filter_delta_update = (RK_U8)value;
                lVar4 = 0;
                do {
                  if (current->loop_filter_delta_update == '\0') {
                    current->update_ref_delta[lVar4] = '\0';
                  }
                  else {
                    RVar3 = mpp_av1_read_unsigned(gb,1,"update_ref_delta[i]",&value,0,1);
                    if (RVar3 < 0) goto LAB_001c6d1d;
                    current->update_ref_delta[lVar4] = (RK_U8)value;
                  }
                  if (current->update_ref_delta[lVar4] == '\0') {
                    current->loop_filter_ref_deltas[lVar4] = local_38[lVar4];
                  }
                  else {
                    RVar3 = mpp_av1_read_signed(gb,7,"loop_filter_ref_deltas[i]",(RK_S32 *)&value,
                                                -0x40,0x3f);
                    if (RVar3 < 0) goto LAB_001c6d1d;
                    current->loop_filter_ref_deltas[lVar4] = (RK_U8)value;
                  }
                  lVar4 = lVar4 + 1;
                } while (lVar4 != 8);
                lVar4 = 0;
                do {
                  if (current->loop_filter_delta_update == '\0') {
                    current->update_mode_delta[lVar4] = '\0';
                  }
                  else {
                    RVar3 = mpp_av1_read_unsigned(gb,1,"update_mode_delta[i]",&value,0,1);
                    if (RVar3 < 0) goto LAB_001c6d1d;
                    current->update_mode_delta[lVar4] = (RK_U8)value;
                  }
                  if (current->update_mode_delta[lVar4] == '\0') {
                    current->loop_filter_mode_deltas[lVar4] = local_40[lVar4];
                  }
                  else {
                    RVar3 = mpp_av1_read_signed(gb,7,"loop_filter_mode_deltas[i]",(RK_S32 *)&value,
                                                -0x40,0x3f);
                    if (RVar3 < 0) goto LAB_001c6d1d;
                    current->loop_filter_mode_deltas[lVar4] = (RK_U8)value;
                  }
                  lVar4 = lVar4 + 1;
                } while (lVar4 == 1);
                bVar1 = true;
              }
              if (!bVar1) {
                return RVar2;
              }
            }
            RVar2 = 0;
          }
        }
      }
    }
  }
  else {
    RVar2 = 0;
    current->loop_filter_level[0] = '\0';
    current->loop_filter_level[1] = '\0';
    current->loop_filter_ref_deltas[0] = '\x01';
    current->loop_filter_ref_deltas[1] = '\0';
    current->loop_filter_ref_deltas[2] = '\0';
    current->loop_filter_ref_deltas[3] = '\0';
    current->loop_filter_ref_deltas[4] = -1;
    current->loop_filter_ref_deltas[5] = '\0';
    current->loop_filter_ref_deltas[6] = -1;
    current->loop_filter_ref_deltas[7] = -1;
    current->loop_filter_mode_deltas[0] = '\0';
    current->loop_filter_mode_deltas[1] = '\0';
  }
  return RVar2;
}

Assistant:

static RK_S32 mpp_av1_loop_filter_params(AV1Context *ctx, BitReadCtx_t *gb,
                                         AV1RawFrameHeader *current)
{
    static const RK_S8 default_loop_filter_ref_deltas[AV1_TOTAL_REFS_PER_FRAME] =
    { 1, 0, 0, 0, -1, 0, -1, -1 };
    static const RK_S8 default_loop_filter_mode_deltas[2] = { 0, 0 };
    RK_S32 i, err;

    if (ctx->coded_lossless || current->allow_intrabc) {
        infer(loop_filter_level[0], 0);
        infer(loop_filter_level[1], 0);
        infer(loop_filter_ref_deltas[AV1_REF_FRAME_INTRA],    1);
        infer(loop_filter_ref_deltas[AV1_REF_FRAME_LAST],     0);
        infer(loop_filter_ref_deltas[AV1_REF_FRAME_LAST2],    0);
        infer(loop_filter_ref_deltas[AV1_REF_FRAME_LAST3],    0);
        infer(loop_filter_ref_deltas[AV1_REF_FRAME_BWDREF],   0);
        infer(loop_filter_ref_deltas[AV1_REF_FRAME_GOLDEN],  -1);
        infer(loop_filter_ref_deltas[AV1_REF_FRAME_ALTREF],  -1);
        infer(loop_filter_ref_deltas[AV1_REF_FRAME_ALTREF2], -1);
        for (i = 0; i < 2; i++)
            infer(loop_filter_mode_deltas[i], 0);
        return 0;
    }

    fb(6, loop_filter_level[0]);
    fb(6, loop_filter_level[1]);

    if (ctx->num_planes > 1) {
        if (current->loop_filter_level[0] ||
            current->loop_filter_level[1]) {
            fb(6, loop_filter_level[2]);
            fb(6, loop_filter_level[3]);
        }
    }

    av1d_dbg(AV1D_DBG_HEADER, "orderhint %d loop_filter_level %d %d %d %d\n",
             current->order_hint,
             current->loop_filter_level[0], current->loop_filter_level[1],
             current->loop_filter_level[2], current->loop_filter_level[3]);
    fb(3, loop_filter_sharpness);

    flag(loop_filter_delta_enabled);
    if (current->loop_filter_delta_enabled) {
        const RK_S8 *ref_loop_filter_ref_deltas, *ref_loop_filter_mode_deltas;

        if (current->primary_ref_frame == AV1_PRIMARY_REF_NONE) {
            ref_loop_filter_ref_deltas = default_loop_filter_ref_deltas;
            ref_loop_filter_mode_deltas = default_loop_filter_mode_deltas;
        } else {
            ref_loop_filter_ref_deltas =
                ctx->ref_s[current->ref_frame_idx[current->primary_ref_frame]].loop_filter_ref_deltas;
            ref_loop_filter_mode_deltas =
                ctx->ref_s[current->ref_frame_idx[current->primary_ref_frame]].loop_filter_mode_deltas;
        }

        flag(loop_filter_delta_update);
        for (i = 0; i < AV1_TOTAL_REFS_PER_FRAME; i++) {
            if (current->loop_filter_delta_update)
                flags(update_ref_delta[i], 1, i);
            else
                infer(update_ref_delta[i], 0);
            if (current->update_ref_delta[i])
                sus(1 + 6, loop_filter_ref_deltas[i], 1, i);
            else
                infer(loop_filter_ref_deltas[i], ref_loop_filter_ref_deltas[i]);
        }
        for (i = 0; i < 2; i++) {
            if (current->loop_filter_delta_update)
                flags(update_mode_delta[i], 1, i);
            else
                infer(update_mode_delta[i], 0);
            if (current->update_mode_delta[i])
                sus(1 + 6, loop_filter_mode_deltas[i], 1, i);
            else
                infer(loop_filter_mode_deltas[i], ref_loop_filter_mode_deltas[i]);
        }
    } else {
        for (i = 0; i < AV1_TOTAL_REFS_PER_FRAME; i++)
            infer(loop_filter_ref_deltas[i], default_loop_filter_ref_deltas[i]);
        for (i = 0; i < 2; i++)
            infer(loop_filter_mode_deltas[i], default_loop_filter_mode_deltas[i]);
    }

    return 0;
}